

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_HT_SINE_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_00000418;
  int *in_stack_00000420;
  int *in_stack_00000428;
  double *in_stack_00000430;
  int in_stack_0000043c;
  int in_stack_00000440;
  double *in_stack_00000450;
  
  TVar1 = TA_HT_SINE(in_stack_00000440,in_stack_0000043c,in_stack_00000430,in_stack_00000428,
                     in_stack_00000420,in_stack_00000418,in_stack_00000450);
  return TVar1;
}

Assistant:

TA_RetCode TA_HT_SINE_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_HT_SINE(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outSine */
/* Generated */                 params->out[1].data.outReal /*  outLeadSine */ );
/* Generated */ }